

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status fdb_iterator_next(fdb_iterator *iterator)

{
  atomic<unsigned_char> *paVar1;
  uint64_t *value_buf;
  wal_item_action wVar2;
  snap_handle *shandle;
  docio_handle *pdVar3;
  size_t sVar4;
  btree_result bVar5;
  fdb_status fVar6;
  btree_result bVar7;
  int iVar8;
  hbtrie_result hVar9;
  wal_item *pwVar10;
  int64_t iVar11;
  byte bVar12;
  uint64_t uVar13;
  ulong uVar14;
  void *key_buf;
  bool bVar15;
  uint64_t offset;
  docio_handle *local_150;
  uint64_t local_148;
  fdb_seqnum_t seqnum;
  docio_object local_138;
  uint64_t hboffset;
  docio_handle *local_f0;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  undefined1 local_88 [8];
  fdb_seqnum_t local_80;
  docio_object local_78;
  size_t seq_kv_len;
  
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  paVar1 = &iterator->handle->handle_busy;
  LOCK();
  bVar15 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\0';
  if (bVar15) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar15) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
    do {
      offset = 0xffffffffffffffff;
      local_138.length.keylen = 0;
      local_138.length.metalen = 0;
      local_138.length.bodylen = 0;
      local_138.length.bodylen_ondisk = 0;
      local_138.length.flag = '\0';
      local_138.length.checksum = '\0';
      local_138.length.reserved = 0;
      local_138.timestamp = 0;
      local_138.meta = (void *)0x0;
      local_138.body = (void *)0x0;
      local_138.key = (void *)0x0;
      local_138.field_3.seqnum = 0;
      if (iterator->direction != '\x01') {
        if (iterator->status == '\0') {
          iterator->_offset = 0xffffffffffffffff;
        }
        if (iterator->tree_cursor_prev != (wal_item *)0x0) {
          pwVar10 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
          iterator->tree_cursor = pwVar10;
          iterator->status = '\0';
        }
      }
      bVar5 = BTREE_RESULT_FAIL;
      do {
        seqnum = iterator->_seqnum;
        local_150 = iterator->handle->dhandle;
        bVar7 = BTREE_RESULT_FAIL;
        if (iterator->_offset == 0xffffffffffffffff) {
          if (iterator->handle->kvs == (kvs_info *)0x0) {
            bVar5 = btree_next(iterator->seqtree_iterator,&seqnum,&offset);
          }
          else {
            hVar9 = hbtrie_next(iterator->seqtrie_iterator,local_88,&seq_kv_len,&offset);
            bVar5 = bVar7;
            if (hVar9 == HBTRIE_RESULT_SUCCESS) {
              buf2kvid(8,local_88,&kv_id);
              seqnum = local_80;
              bVar5 = (uint)(kv_id != iterator->handle->kvs->id) * 2;
            }
          }
          btreeblk_end(iterator->handle->bhandle);
          if (bVar5 != BTREE_RESULT_SUCCESS) goto LAB_00132057;
          seqnum = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
                   (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
                   (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 |
                   (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
          iterator->_seqnum = seqnum;
          if ((iterator->field_12).end_seqnum < seqnum) goto LAB_0013237c;
          offset = offset >> 0x38 | (offset & 0xff000000000000) >> 0x28 |
                   (offset & 0xff0000000000) >> 0x18 | (offset & 0xff00000000) >> 8 |
                   (offset & 0xff000000) << 8 | (offset & 0xff0000) << 0x18 |
                   (offset & 0xff00) << 0x28 | offset << 0x38;
          iterator->_offset = 0xffffffffffffffff;
          iterator->status = '\0';
          bVar15 = true;
        }
        else {
LAB_00132057:
          if (bVar5 == BTREE_RESULT_FAIL) {
            pwVar10 = iterator->tree_cursor;
            if (pwVar10 != (wal_item *)0x0) {
              bVar15 = iterator->status == '\x01';
              do {
                if (bVar15) {
                  iterator->tree_cursor_prev = pwVar10;
                  pwVar10 = wal_itr_next(iterator->wal_itr);
                  iterator->tree_cursor = pwVar10;
                  if (pwVar10 == (wal_item *)0x0) goto LAB_0013237c;
                }
                iterator->status = '\x01';
                bVar15 = true;
              } while ((((iterator->opt & 1) == 0) &&
                       (pwVar10->action == '\x02' ||
                        (pwVar10->action == '\x01' & (byte)((iterator->opt & 2) >> 1)) != 0)) ||
                      (uVar14 = pwVar10->seqnum, uVar14 < iterator->_seqnum));
              if (uVar14 <= (iterator->field_12).end_seqnum) {
                offset = pwVar10->offset;
                iterator->_offset = offset;
                iterator->_seqnum = uVar14;
                bVar15 = false;
                goto LAB_0013212d;
              }
            }
LAB_0013237c:
            fVar6 = FDB_RESULT_ITERATOR_FAIL;
            goto LAB_0013237f;
          }
          bVar15 = bVar5 == BTREE_RESULT_SUCCESS;
        }
LAB_0013212d:
        if ((!bVar15) || ((iterator->opt & 1) != 0)) goto LAB_00132694;
        local_138.key = (void *)0x0;
        local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
        local_138.meta = (void *)0x0;
        local_138.body = (void *)0x0;
        _offset = docio_read_doc_key_meta(local_150,offset,&local_138,true);
        if (_offset < 1) {
          fVar6 = (fdb_status)_offset;
          if (_offset == 0) {
            fVar6 = FDB_RESULT_KEY_NOT_FOUND;
          }
          goto LAB_00132371;
        }
        if (((local_138.length._8_8_ & 0x400000000) != 0) && ((iterator->opt & 2) != 0)) {
          free(local_138.key);
          free(local_138.meta);
          fVar6 = FDB_RESULT_KEY_NOT_FOUND;
          goto LAB_00132371;
        }
        doc_kv.key = local_138.key;
        doc_kv.keylen = local_138.length._0_8_ & 0xffff;
        doc_kv.seqnum = 0xffffffffffffffff;
        shandle = iterator->handle->shandle;
        fVar6 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,&doc_kv
                         ,(uint64_t *)&_offset);
        if (((fVar6 == FDB_RESULT_SUCCESS) && ((iterator->field_10).start_seqnum <= doc_kv.seqnum))
           && (doc_kv.seqnum <= (iterator->field_12).end_seqnum)) {
LAB_0013223c:
          free(local_138.key);
          free(local_138.meta);
        }
        else {
          local_78.timestamp = 0;
          local_78.length.keylen = 0;
          local_78.length.metalen = 0;
          local_78.length.bodylen = 0;
          local_78.length.bodylen_ondisk = 0;
          local_78.length.flag = '\0';
          local_78.length.checksum = '\0';
          local_78.length.reserved = 0;
          local_78.meta = (void *)0x0;
          local_78.body = (void *)0x0;
          local_78.key = (void *)0x0;
          local_78.field_3.seqnum = 0;
          hVar9 = hbtrie_find(iterator->handle->trie,local_138.key,(uint)local_138.length.keylen,
                              &hboffset);
          btreeblk_end(iterator->handle->bhandle);
          if (hVar9 != HBTRIE_RESULT_SUCCESS) goto LAB_0013223c;
          local_78.key = local_138.key;
          local_78.meta = (void *)0x0;
          hboffset = hboffset >> 0x38 | (hboffset & 0xff000000000000) >> 0x28 |
                     (hboffset & 0xff0000000000) >> 0x18 | (hboffset & 0xff00000000) >> 8 |
                     (hboffset & 0xff000000) << 8 | (hboffset & 0xff0000) << 0x18 |
                     (hboffset & 0xff00) << 0x28 | hboffset << 0x38;
          iVar11 = docio_read_doc_key_meta(iterator->handle->dhandle,hboffset,&local_78,true);
          if (iVar11 < 1) {
            free(local_138.key);
            free(local_138.meta);
            if (iVar11 == 0) {
              iVar11 = -9;
            }
            bVar7 = BTREE_RESULT_UPDATE;
            local_148 = CONCAT44(local_148._4_4_,(int)iVar11);
          }
          else if ((local_138.field_3.seqnum < local_78.field_3.seqnum) &&
                  ((ulong)local_78.field_3 <= (iterator->field_12).end_seqnum)) {
            free(local_138.key);
            free(local_138.meta);
            free(local_78.meta);
          }
          else {
            free(local_78.meta);
            free(local_138.key);
            free(local_138.meta);
            bVar7 = BTREE_RESULT_SUCCESS;
          }
        }
        bVar5 = BTREE_RESULT_SUCCESS;
      } while (bVar7 == BTREE_RESULT_FAIL);
      if (bVar7 == BTREE_RESULT_SUCCESS) {
LAB_00132694:
        iterator->_dhandle = local_150;
        iterator->_get_offset = offset;
        fVar6 = FDB_RESULT_SUCCESS;
        break;
      }
      fVar6 = (fdb_status)local_148;
LAB_00132371:
    } while (fVar6 == FDB_RESULT_KEY_NOT_FOUND);
LAB_0013237f:
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00132615;
  }
  else {
    if (iterator->direction != '\x01') {
      iterator->_offset = 0xffffffffffffffff;
      if (iterator->tree_cursor == (wal_item *)0x0) {
        if (iterator->tree_cursor_prev != (wal_item *)0x0) {
          pwVar10 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
          iterator->tree_cursor = pwVar10;
          iterator->status = '\0';
        }
      }
      else {
        pwVar10 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor);
        iterator->tree_cursor = pwVar10;
        if ((iterator->direction == '\x02') && (iterator->status != '\x01')) {
          pwVar10 = wal_itr_next(iterator->wal_itr);
          iterator->tree_cursor = pwVar10;
        }
      }
    }
    value_buf = &iterator->_offset;
    hVar9 = HBTRIE_RESULT_SUCCESS;
LAB_001323b3:
    do {
      key_buf = iterator->_key;
      pdVar3 = iterator->handle->dhandle;
      if (iterator->_offset == 0xffffffffffffffff) {
        doc_kv.bodylen = doc_kv.bodylen & 0xffffffff00000000;
        doc_kv.keylen = 0;
        doc_kv.metalen = 0;
        doc_kv.seqnum = 0;
        doc_kv.offset = 0;
        doc_kv.size_ondisk = 0;
        doc_kv.key = (void *)0x0;
        do {
          do {
            hVar9 = hbtrie_next(iterator->hbtrie_iterator,key_buf,&iterator->_keylen,value_buf);
            btreeblk_end(iterator->handle->bhandle);
            uVar14 = iterator->_offset;
            uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                     (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                     (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                     (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
            iterator->_offset = uVar14;
            if (((iterator->opt & 2) == 0) || (hVar9 != HBTRIE_RESULT_SUCCESS)) goto LAB_001323cc;
            doc_kv.key = (void *)0x0;
            doc_kv.seqnum = 0;
            doc_kv.bodylen = 0;
            doc_kv.size_ondisk = 0;
            doc_kv.keylen = 0;
            doc_kv.metalen = 0;
            doc_kv.offset = 0;
            iVar11 = docio_read_doc_key_meta(pdVar3,uVar14,(docio_object *)&doc_kv,true);
            sVar4 = doc_kv.metalen;
          } while (iVar11 < 1);
          free((void *)doc_kv.size_ondisk);
          free((void *)doc_kv.seqnum);
        } while ((sVar4 & 0x400000000) != 0);
        hVar9 = HBTRIE_RESULT_SUCCESS;
      }
LAB_001323cc:
      if (hVar9 == HBTRIE_RESULT_INDEX_CORRUPTED) {
        fVar6 = FDB_RESULT_FILE_CORRUPTION;
        goto LAB_00132615;
      }
      local_150 = (docio_handle *)iterator->_keylen;
      local_148 = *value_buf;
      if ((hVar9 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0)) {
LAB_00132612:
        fVar6 = FDB_RESULT_ITERATOR_FAIL;
        goto LAB_00132615;
      }
      do {
        local_f0 = pdVar3;
        pwVar10 = iterator->tree_cursor;
        uVar13 = local_148;
        if (pwVar10 == (wal_item *)0x0) goto LAB_0013259a;
        if (iterator->status == '\x01') {
          iterator->tree_cursor_prev = pwVar10;
          pwVar10 = wal_itr_next(iterator->wal_itr);
          iterator->tree_cursor = pwVar10;
          if (pwVar10 == (wal_item *)0x0) {
            uVar13 = local_148;
            if (hVar9 == HBTRIE_RESULT_SUCCESS) goto LAB_0013259a;
            goto LAB_00132612;
          }
        }
        iVar8 = -1;
        if ((hVar9 == HBTRIE_RESULT_SUCCESS) &&
           (iVar8 = _fdb_key_cmp(iterator,pwVar10->header->key,(ulong)pwVar10->header->keylen,
                                 key_buf,(size_t)local_150), uVar13 = local_148, 0 < iVar8))
        goto LAB_0013259a;
        wVar2 = pwVar10->action;
        if (wVar2 == '\x01') {
          bVar12 = ((byte)iterator->opt & 2) >> 1;
        }
        else {
          bVar12 = 0;
        }
        iterator->status = '\x01';
        if (-1 < iVar8) {
          *value_buf = 0xffffffffffffffff;
          if (wVar2 == '\x02' || bVar12 != 0) goto LAB_001323b3;
          break;
        }
        pdVar3 = local_f0;
      } while (wVar2 == '\x02' || bVar12 != 0);
      key_buf = pwVar10->header->key;
      local_150 = (docio_handle *)(ulong)pwVar10->header->keylen;
      uVar13 = pwVar10->offset;
LAB_0013259a:
      if (uVar13 == *value_buf) {
        iterator->_offset = 0xffffffffffffffff;
        iterator->status = '\0';
      }
      if (iterator->start_key == (void *)0x0) break;
      iVar8 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,key_buf,
                           (size_t)local_150);
      if (iVar8 != 0) {
        if (iVar8 < 1) break;
        goto LAB_001323b3;
      }
    } while ((iterator->opt & 4) != 0);
    pdVar3 = local_f0;
    fVar6 = FDB_RESULT_ITERATOR_FAIL;
    if (iterator->end_key != (void *)0x0) {
      iVar8 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,key_buf,
                           (size_t)local_150);
      if (iVar8 == 0) {
        if ((iterator->opt & 8) == 0) goto LAB_00132647;
      }
      else if (-1 < iVar8) goto LAB_00132647;
LAB_00132615:
      iterator->_dhandle = (docio_handle *)0x0;
      if ((iterator->direction != '\0') &&
         (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
           (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0'))))
      {
        iterator->_offset = 0xffffffffffffffff;
      }
      goto LAB_0013265b;
    }
LAB_00132647:
    iterator->_dhandle = pdVar3;
    iterator->_get_offset = uVar13;
  }
  iterator->direction = '\x01';
  fVar6 = FDB_RESULT_SUCCESS;
LAB_0013265b:
  paVar1 = &iterator->handle->handle_busy;
  LOCK();
  if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
  }
  UNLOCK();
  atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,memory_order_relaxed);
  return fVar6;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_next(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_FORWARD;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_NEXT);
    return result;
}